

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **param_2)

{
  clock_t cVar1;
  ostream *poVar2;
  clock_t cVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  cVar1 = clock();
  testingBN();
  testing();
  testingMul();
  testingExp();
  if (1 < argc) {
    resulttest();
  }
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 3;
  poVar2 = std::operator<<((ostream *)&std::cout,"Seconds: ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  cVar3 = clock();
  lVar4 = cVar3 - cVar1;
  auVar5._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar5._0_8_ = lVar4;
  auVar5._12_4_ = 0x45300000;
  poVar2 = std::ostream::_M_insert<double>
                     (((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 1000000.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main(int argc, char**) {
    uint64_t t = clock();

    try {
        testingBN();
        testing();
        testingMul();
        testingExp();
        if (argc > 1)
            resulttest();
    } catch (const std::exception& exc) {
        cerr << exc.what() << endl;
        return -1;
    }
    cout.precision(3);
    cout << "Seconds: " << fixed << static_cast<double>(clock() - t) / CLOCKS_PER_SEC << endl;
    return 0;
}